

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeCallIndirect(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  Module *pMVar1;
  char *pcVar2;
  Type type_00;
  uint32_t uVar3;
  uint32_t uVar4;
  long lVar5;
  Expression *pEVar6;
  long lVar7;
  Type *pTVar8;
  uintptr_t *puVar9;
  CallIndirect *pCVar10;
  long extraout_RDX;
  long extraout_RDX_00;
  uintptr_t extraout_RDX_01;
  bool isReturn;
  Name NVar11;
  Name NVar12;
  Literal local_98;
  Type local_80;
  Expression *local_78;
  Random *local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Iterator __begin1;
  
  pMVar1 = this->wasm;
  this_00 = &this->random;
  uVar3 = Random::upTo(this_00,(uint32_t)
                               ((ulong)(*(long *)(pMVar1 + 0x68) - *(long *)(pMVar1 + 0x60)) >> 3));
  lVar7 = *(long *)(*(long *)(pMVar1 + 0x60) + (ulong)uVar3 * 8);
  if (*(long *)(lVar7 + 0x38) == *(long *)(lVar7 + 0x40)) {
    pEVar6 = make(this,type);
    return pEVar6;
  }
  local_70 = this_00;
  uVar4 = Random::upTo(this_00,(uint32_t)
                               ((ulong)(*(long *)(lVar7 + 0x40) - *(long *)(lVar7 + 0x38)) >> 3));
  lVar5 = *(long *)(lVar7 + 0x38);
  uVar3 = uVar4;
  do {
    pcVar2 = *(char **)(lVar5 + (ulong)uVar3 * 8);
    if (*pcVar2 == '+') {
      NVar11.super_IString.str._M_str = *(char **)(pcVar2 + 0x10);
      NVar11.super_IString.str._M_len = (size_t)this->wasm;
      lVar5 = wasm::Module::getFunction(NVar11);
      if ((type.id == 1) && (((byte)this->wasm[0x178] & 0x80) != 0)) {
        wasm::HeapType::getSignature();
        wasm::HeapType::getSignature();
        isReturn = extraout_RDX == extraout_RDX_00;
      }
      else {
        isReturn = false;
      }
      wasm::HeapType::getSignature();
      if ((isReturn != false) || (extraout_RDX_01 == type.id)) {
        NVar12.super_IString.str._M_str = (char *)(this->funcrefTableName).super_IString.str._M_len;
        NVar12.super_IString.str._M_len = (size_t)this->wasm;
        lVar7 = wasm::Module::getTable(NVar12);
        type_00.id = *(uintptr_t *)(lVar7 + 0x48);
        if (this->allowOOB == true) {
          uVar4 = Random::upTo(local_70,10);
          if (uVar4 == 0) {
            __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
                 (size_t)make(this,type_00);
            goto LAB_0012e985;
          }
        }
        Literal::makeFromInt32(&local_98,uVar3,type_00);
        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
             (size_t)Builder::makeConst(&this->builder,&local_98);
        wasm::Literal::~Literal(&local_98);
LAB_0012e985:
        auStack_68 = (undefined1  [8])0x0;
        args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_80.id = wasm::HeapType::getSignature();
        args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&local_80;
        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        pTVar8 = (Type *)Type::size((Type *)args.
                                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (pTVar8 != (Type *)0x0) {
          do {
            do {
              puVar9 = (uintptr_t *)
                       wasm::Type::Iterator::operator*
                                 ((Iterator *)
                                  &args.
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_78 = make(this,(Type)*puVar9);
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              emplace_back<wasm::Expression*>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                         &local_78);
              __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)((long)&(__begin1.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent)->id + 1);
            } while (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent != pTVar8);
          } while ((Type *)args.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage != &local_80);
        }
        pCVar10 = Builder::
                  makeCallIndirect<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                            (&this->builder,(Name)(this->funcrefTableName).super_IString.str,
                             (Expression *)
                             __begin1.
                             super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             index,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)auStack_68,(HeapType)*(uintptr_t *)(lVar5 + 0x38),isReturn);
        if (auStack_68 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_68,
                          (long)args.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
        }
        return (Expression *)pCVar10;
      }
      lVar5 = *(long *)(lVar7 + 0x38);
    }
    uVar3 = uVar3 + 1;
    if (*(long *)(lVar7 + 0x40) - lVar5 >> 3 == (ulong)uVar3) {
      uVar3 = 0;
    }
    if (uVar3 == uVar4) {
      pEVar6 = makeTrivial(this,type);
      return pEVar6;
    }
  } while( true );
}

Assistant:

Expression* TranslateToFuzzReader::makeCallIndirect(Type type) {
  auto& randomElem = wasm.elementSegments[upTo(wasm.elementSegments.size())];
  auto& data = randomElem->data;
  if (data.empty()) {
    return make(type);
  }
  // look for a call target with the right type
  Index start = upTo(data.size());
  Index i = start;
  Function* targetFn;
  bool isReturn;
  while (1) {
    // TODO: handle unreachable
    if (auto* get = data[i]->dynCast<RefFunc>()) {
      targetFn = wasm.getFunction(get->func);
      isReturn = type == Type::unreachable && wasm.features.hasTailCall() &&
                 funcContext->func->getResults() == targetFn->getResults();
      if (targetFn->getResults() == type || isReturn) {
        break;
      }
    }
    i++;
    if (i == data.size()) {
      i = 0;
    }
    if (i == start) {
      return makeTrivial(type);
    }
  }
  // with high probability, make sure the type is valid - otherwise, most are
  // going to trap
  auto addressType = wasm.getTable(funcrefTableName)->addressType;
  Expression* target;
  if (!allowOOB || !oneIn(10)) {
    target = builder.makeConst(Literal::makeFromInt32(i, addressType));
  } else {
    target = make(addressType);
  }
  std::vector<Expression*> args;
  for (const auto& type : targetFn->getParams()) {
    args.push_back(make(type));
  }
  // TODO: use a random table
  return builder.makeCallIndirect(
    funcrefTableName, target, args, targetFn->type, isReturn);
}